

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O2

void gai_zdot_patch_(Integer *g_a,char *t_a,Integer *ailo,Integer *aihi,Integer *ajlo,Integer *ajhi,
                    Integer *g_b,char *t_b,Integer *bilo,Integer *bihi,Integer *bjlo,Integer *bjhi,
                    DoubleComplex *retval,int alen,int blen)

{
  Integer btype;
  Integer atype;
  
  pnga_inquire_type(*g_a,&atype);
  pnga_inquire_type(*g_b,&btype);
  if ((atype != 0x3ef) || (btype != 0x3ef)) {
    pnga_error(" wrong types ",0);
  }
  sga_dot_patch(*g_a,t_a,ailo,aihi,ajlo,ajhi,*g_b,t_b,bilo,bihi,bjlo,bjhi,retval);
  return;
}

Assistant:

void gai_zdot_patch_(Integer *g_a, char *t_a, int alen, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, Integer *g_b, char *t_b, int blen, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi, DoubleComplex *retval)
#endif
{
    Integer atype, btype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    if (atype != btype || atype != C_DCPL) pnga_error(" wrong types ", 0L);
    sga_dot_patch(*g_a, t_a, ailo, aihi, ajlo, ajhi, *g_b, t_b, bilo, bihi, bjlo, bjhi, retval);
}